

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O2

void __thiscall deqp::gles3::Functional::TransformFeedback::Varying::~Varying(Varying *this)

{
  glu::VarType::~VarType(&this->type);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Varying				(const char* name_, const glu::VarType& type_, Interpolation interp_)
							: name			(name_)
							, type			(type_)
							, interpolation	(interp_)
						{
						}